

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDEdgeChain::RemoveEdges(ON_SubDEdgeChain *this,ON_SubDEdge *first_edge,ON_SubDEdge *last_edge)

{
  ON_UniqueTester *this_00;
  uint uVar1;
  long lVar2;
  uint uVar3;
  ON_SubDEdgePtr *pOVar4;
  ON_SubDVertex *pOVar5;
  ON_SubDVertex *x;
  uint uVar6;
  ulong uVar7;
  uint uVar9;
  ulong uVar10;
  ON__UINT_PTR x_00;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar8;
  
  uVar1 = (this->m_edge_chain).m_count;
  uVar12 = (ulong)uVar1;
  if (first_edge == (ON_SubDEdge *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar7 = 0;
    while ((uVar8 = uVar12, uVar12 != uVar7 &&
           (uVar8 = uVar7,
           (ON_SubDEdge *)((this->m_edge_chain).m_a[uVar7].m_ptr & 0xfffffffffffffff8) != first_edge
           ))) {
      uVar7 = uVar7 + 1;
    }
  }
  uVar6 = (uint)uVar8;
  uVar10 = uVar8 & 0xffffffff;
  uVar7 = uVar12;
  if (last_edge != (ON_SubDEdge *)0x0) {
    uVar11 = uVar12;
    if (uVar6 < uVar1) {
      uVar11 = uVar8 & 0xffffffff;
    }
    uVar8 = (ulong)(uVar1 + 1);
    do {
      uVar7 = uVar11;
      if (uVar12 <= uVar10) break;
      lVar2 = uVar12 - 1;
      uVar12 = uVar12 - 1;
      uVar7 = (ulong)((int)uVar8 - 1);
      uVar8 = uVar7;
    } while ((ON_SubDEdge *)((this->m_edge_chain).m_a[lVar2].m_ptr & 0xfffffffffffffff8) !=
             last_edge);
  }
  uVar9 = (int)uVar7 - uVar6;
  uVar13 = uVar1 - uVar9;
  uVar3 = 0;
  if (uVar9 <= uVar1 && uVar13 != 0) {
    if (uVar6 != 0) {
      pOVar4 = (this->m_edge_chain).m_a;
      for (uVar12 = uVar10; uVar12 < uVar7; uVar12 = uVar12 + 1) {
        pOVar4->m_ptr = pOVar4[uVar10].m_ptr;
        pOVar4 = pOVar4 + 1;
      }
    }
    if ((-1 < (int)uVar9) && ((int)uVar9 <= (this->m_edge_chain).m_capacity)) {
      (this->m_edge_chain).m_count = uVar9;
    }
    this_00 = &this->m_unique_tester;
    ON_UniqueTester::Internal_Destroy(this_00);
    for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      ON_UniqueTester::AddToList
                (this_00,(this->m_edge_chain).m_a[uVar12].m_ptr & 0xfffffffffffffff8);
      uVar8 = (this->m_edge_chain).m_a[uVar12].m_ptr;
      uVar7 = uVar8 & 0xfffffffffffffff8;
      if (uVar7 == 0) {
        x_00 = 0;
      }
      else {
        x_00 = *(ON__UINT_PTR *)(uVar7 + 0x80 + (ulong)((uint)uVar8 & 1) * 8);
      }
      ON_UniqueTester::AddToList(this_00,x_00);
    }
    pOVar5 = FirstVertex(this);
    x = LastVertex(this);
    uVar3 = uVar13;
    if (pOVar5 != x) {
      ON_UniqueTester::AddToList(this_00,(ON__UINT_PTR)x);
    }
  }
  return uVar3;
}

Assistant:

unsigned int ON_SubDEdgeChain::RemoveEdges(
  const ON_SubDEdge* first_edge,
  const ON_SubDEdge* last_edge
) 
{
  unsigned int count0 = m_edge_chain.UnsignedCount();
  unsigned int i0 = 0;
  unsigned int i1 = count0;
  if (nullptr != first_edge)
  {
    while (i0 < count0 && first_edge != m_edge_chain[i0].Edge())
      ++i0;
  }
  if (nullptr != last_edge)
  {
    while (i1 > i0 && last_edge != m_edge_chain[i1 - 1].Edge())
      --i1;
  }

  const unsigned int count1 = i1 - i0;
  if (count1 >= count0)
    return 0;

  if (i0 > 0)
  {
    for (unsigned int i = i0; i < i1; i++)
      m_edge_chain[i - i0] = m_edge_chain[i];
  }

  m_edge_chain.SetCount(count1);
  m_unique_tester.ClearList();
  for (unsigned int i = 0; i < count1; i++)
  {
    m_unique_tester.AddToList((ON__UINT_PTR)m_edge_chain[i].Edge());
    m_unique_tester.AddToList((ON__UINT_PTR)m_edge_chain[i].RelativeVertex(0));
  }
  if ( FirstVertex() != LastVertex() )
    m_unique_tester.AddToList((ON__UINT_PTR)LastVertex());

  return count0 - count1;
}